

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::GetClangTidyReplacementsFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *directory,
          cmSourceFile *source,string *config)

{
  string *args_2;
  cmGlobalNinjaGenerator *pcVar1;
  char local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)&this->LocalGenerator->HomeRelativeOutputPath);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  local_88._M_dataplus._M_p._0_1_ = 0x2f;
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
            (&local_48,directory,(char *)&local_88,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  args_2 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget,source);
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    super_cmOutputConverter._vptr_cmOutputConverter[0x10])
            (&local_88,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar1 = GetGlobalGenerator(this);
  (*(pcVar1->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d])
            (&local_68,pcVar1,config);
  local_89 = '/';
  cmStrCat<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[6]>
            (&local_48,__return_storage_ptr__,&local_88,&local_68,&local_89,args_2,
             (char (*) [6])0x7df78b);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetClangTidyReplacementsFilePath(
  std::string const& directory, cmSourceFile const& source,
  std::string const& config) const
{
  auto path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += '/';
  }
  path = cmStrCat(directory, '/', path);
  auto const& objectName = this->GeneratorTarget->GetObjectName(&source);
  path =
    cmStrCat(std::move(path),
             this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
             this->GetGlobalGenerator()->ConfigDirectory(config), '/',
             objectName, ".yaml");
  return path;
}